

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool ModulusSignedCaseHelper<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::SignedCase(SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs,SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *result)

{
  int local_c;
  
  if (rhs.m_int == -1) {
    local_c = 0;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)result,&local_c);
  }
  return rhs.m_int == -1;
}

Assistant:

static bool SignedCase( SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_NOTHROW
    {
        if( (T)rhs == (T)-1 )
        {
            result = 0;
            return true;
        }
        return false;
    }